

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O2

bool __thiscall cfd::core::ByteData160::operator==(ByteData160 *this,ByteData160 *object)

{
  pointer __s1;
  pointer puVar1;
  pointer __s2;
  int iVar2;
  size_t __n;
  
  __s1 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
  puVar1 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __s2 = (object->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
  if ((long)puVar1 - (long)__s1 !=
      (long)(object->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish - (long)__s2) {
    return false;
  }
  __n = (long)puVar1 - (long)__s1;
  if (__n != 0) {
    iVar2 = bcmp(__s1,__s2,__n);
    return iVar2 == 0;
  }
  return true;
}

Assistant:

bool ByteData160::operator==(const ByteData160& object) const {
  return (data_ == object.data_);
}